

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *format,char *format_max,ImGuiSliderFlags flags)

{
  float *text;
  bool bVar1;
  char *text_end;
  uint uVar2;
  float w_full;
  char *local_a0;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_78;
  ImGuiSliderFlags max_flags;
  float max_max;
  float max_min;
  float fStack_68;
  bool value_changed;
  ImGuiSliderFlags min_flags;
  float min_max;
  float min_min;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *pcStack_48;
  ImGuiSliderFlags flags_local;
  char *format_max_local;
  char *format_local;
  float local_30;
  float v_max_local;
  float v_min_local;
  float v_speed_local;
  float *v_current_max_local;
  float *v_current_min_local;
  char *label_local;
  
  window._4_4_ = flags;
  pcStack_48 = format_max;
  format_max_local = format;
  format_local._4_4_ = v_max;
  local_30 = v_min;
  v_max_local = v_speed;
  _v_min_local = v_current_max;
  v_current_max_local = v_current_min;
  v_current_min_local = (float *)label;
  g = (ImGuiContext *)GetCurrentWindow();
  if (((g->IO).ConfigViewportsNoAutoMerge & 1U) == 0) {
    _min_max = GImGui;
    PushID((char *)v_current_min_local);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    if (local_30 < format_local._4_4_) {
      local_80 = local_30;
    }
    else {
      local_80 = -3.4028235e+38;
    }
    min_flags = (ImGuiSliderFlags)local_80;
    if (local_30 < format_local._4_4_) {
      local_84 = ImMin<float>(format_local._4_4_,*_v_min_local);
    }
    else {
      local_84 = *_v_min_local;
    }
    fStack_68 = local_84;
    uVar2 = 0;
    if ((float)min_flags == local_84) {
      uVar2 = 0x200000;
    }
    max_min = (float)(window._4_4_ | uVar2);
    max_max._3_1_ =
         DragScalar("##min",8,v_current_max_local,v_max_local,&min_flags,&stack0xffffffffffffff98,
                    format_max_local,(ImGuiSliderFlags)max_min);
    PopItemWidth();
    SameLine(0.0,(_min_max->Style).ItemInnerSpacing.x);
    if (local_30 < format_local._4_4_) {
      local_88 = ImMax<float>(local_30,*v_current_max_local);
    }
    else {
      local_88 = *v_current_max_local;
    }
    max_flags = (ImGuiSliderFlags)local_88;
    if (local_30 < format_local._4_4_) {
      local_8c = format_local._4_4_;
    }
    else {
      local_8c = 3.4028235e+38;
    }
    local_78 = local_8c;
    uVar2 = 0;
    if (local_88 == local_8c) {
      uVar2 = 0x200000;
    }
    if (pcStack_48 == (char *)0x0) {
      local_a0 = format_max_local;
    }
    else {
      local_a0 = pcStack_48;
    }
    bVar1 = DragScalar("##max",8,_v_min_local,v_max_local,&max_flags,&local_78,local_a0,
                       window._4_4_ | uVar2);
    max_max._3_1_ = (max_max._3_1_ & 1) != 0 || bVar1;
    PopItemWidth();
    SameLine(0.0,(_min_max->Style).ItemInnerSpacing.x);
    text = v_current_min_local;
    text_end = FindRenderedTextEnd((char *)v_current_min_local,(char *)0x0);
    TextEx((char *)text,text_end,0);
    EndGroup();
    PopID();
    label_local._7_1_ = (bool)(max_max._3_1_ & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}